

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O2

JavascriptFunction * __thiscall Js::BoundFunction::GetTargetFunction(BoundFunction *this)

{
  code *pcVar1;
  bool bVar2;
  JavascriptProxy *this_00;
  RecyclableObject *obj;
  JavascriptFunction *pJVar3;
  undefined4 *puVar4;
  
  obj = (this->targetFunction).ptr;
  if (obj != (RecyclableObject *)0x0) {
    while (bVar2 = VarIsImpl<Js::JavascriptProxy>(obj), bVar2) {
      this_00 = VarTo<Js::JavascriptProxy,Js::RecyclableObject>(obj);
      obj = JavascriptProxy::GetTarget(this_00);
    }
    bVar2 = VarIsImpl<Js::JavascriptFunction>(obj);
    if (bVar2) {
      pJVar3 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(obj);
      return pJVar3;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x101,"(0)","FALSE");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return (JavascriptFunction *)0x0;
}

Assistant:

JavascriptFunction * BoundFunction::GetTargetFunction() const
    {
        if (targetFunction != nullptr)
        {
            RecyclableObject* _targetFunction = targetFunction;
            while (VarIs<JavascriptProxy>(_targetFunction))
            {
                _targetFunction = VarTo<JavascriptProxy>(_targetFunction)->GetTarget();
            }

            if (VarIs<JavascriptFunction>(_targetFunction))
            {
                return VarTo<JavascriptFunction>(_targetFunction);
            }

            // targetFunction should always be a JavascriptFunction.
            Assert(FALSE);
        }
        return nullptr;
    }